

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionMeshCollection.cpp
# Opt level: O3

aphy_error __thiscall
APhyBullet::APhyBulletCollisionMeshCollection::addCollisionMeshAccessor
          (APhyBulletCollisionMeshCollection *this,aphy_collision_mesh_accessor *accessor,
          aphy_transform *transform)

{
  undefined1 auVar1 [12];
  aphy_error aVar2;
  undefined1 local_48 [16];
  btScalar local_38;
  btScalar bStack_34;
  uchar *local_30;
  btScalar local_28;
  btScalar bStack_24;
  btScalar local_20;
  btScalar local_1c;
  btVector3 local_18;
  
  if (accessor == (aphy_collision_mesh_accessor *)0x0) {
    aVar2 = APHY_NULL_POINTER;
  }
  else if (transform == (aphy_transform *)0x0) {
    local_48._0_4_ = accessor->index_count / 3;
    local_48._8_8_ = (ulong)accessor->index_offset + (long)accessor->indices;
    bStack_34 = (btScalar)accessor->vertex_count;
    local_38 = (btScalar)(accessor->index_stride * 3);
    local_30 = (uchar *)((ulong)accessor->vertex_offset + (long)accessor->vertices);
    bStack_24 = 2.8026e-45;
    local_28 = (btScalar)accessor->vertex_stride;
    local_20 = 0.0;
    btTriangleIndexVertexArray::addIndexedMesh
              (&(this->triangleMeshData).super_btTriangleIndexVertexArray,(btIndexedMesh *)local_48,
               accessor->index_stride == 2 | PHY_INTEGER);
    aVar2 = APHY_OK;
  }
  else {
    local_20 = (transform->rotation).thirdRow.z;
    local_48._0_4_ = (transform->rotation).firstRow.x;
    local_48._4_4_ = (transform->rotation).firstRow.y;
    aVar2 = APHY_OK;
    local_48._12_4_ = 0;
    local_48._8_4_ = (transform->rotation).firstRow.z;
    local_38 = (transform->rotation).secondRow.x;
    bStack_34 = (transform->rotation).secondRow.y;
    local_30 = (uchar *)(ulong)(uint)(transform->rotation).secondRow.z;
    local_28 = (transform->rotation).thirdRow.x;
    bStack_24 = (transform->rotation).thirdRow.y;
    local_1c = 0.0;
    auVar1 = SUB1612(transform->origin,0);
    local_18.m_floats[3] = 0.0;
    local_18.m_floats[0] = (btScalar)auVar1._0_4_;
    local_18.m_floats[1] = (btScalar)auVar1._4_4_;
    local_18.m_floats[2] = (btScalar)auVar1._8_4_;
    addCollisionMeshAccessorWithTransform(this,accessor,(btTransform *)local_48);
  }
  return aVar2;
}

Assistant:

aphy_error APhyBulletCollisionMeshCollection::addCollisionMeshAccessor(aphy_collision_mesh_accessor* accessor, aphy_transform* transform)
{
    CHECK_POINTER(accessor);

    if(transform)
        return addCollisionMeshAccessorWithTransform(accessor, convertAPhyTransform(*transform));

    btIndexedMesh indexedMesh;
    indexedMesh.m_numTriangles = accessor->index_count / 3;
    indexedMesh.m_triangleIndexBase = reinterpret_cast<uint8_t*> (accessor->indices) + accessor->index_offset;
    indexedMesh.m_triangleIndexStride = accessor->index_stride * 3;
    indexedMesh.m_numVertices = accessor->vertex_count;
    indexedMesh.m_vertexBase = reinterpret_cast<uint8_t*> (accessor->vertices) + accessor->vertex_offset;
    indexedMesh.m_vertexStride = accessor->vertex_stride;
    indexedMesh.m_vertexType = PHY_FLOAT;
    //printf("m_vertexBase %p m_triangleIndexBase %p\n", indexedMesh.m_vertexBase, indexedMesh.m_triangleIndexBase);
    //printf("m_numTriangles %d m_triangleIndexStride %d m_numVertices %d m_vertexStride %d\n", indexedMesh.m_numTriangles, indexedMesh.m_triangleIndexStride, indexedMesh.m_numVertices, indexedMesh.m_vertexStride);
    triangleMeshData.addIndexedMesh(indexedMesh, accessor->index_stride == 2 ? PHY_SHORT : PHY_INTEGER);
    return APHY_OK;
}